

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void __thiscall OjaNewton::update_eigenvalues(OjaNewton *this)

{
  long in_RDI;
  float fVar1;
  float fVar2;
  double dVar3;
  float tmp;
  float gamma;
  int i;
  undefined4 local_c;
  
  for (local_c = 1; local_c <= *(int *)(in_RDI + 8); local_c = local_c + 1) {
    dVar3 = std::fmin((double)(ulong)(uint)(*(float *)(in_RDI + 0xa8) /
                                           (float)*(int *)(in_RDI + 0x18)),5.26354424712089e-315);
    fVar1 = SUB84(dVar3,0);
    fVar2 = *(float *)(*(long *)(in_RDI + 0x90) + (long)local_c * 4) * *(float *)(in_RDI + 0x7c);
    if (*(int *)(in_RDI + 0x18) == 1) {
      *(float *)(*(long *)(in_RDI + 0x20) + (long)local_c * 4) = fVar1 * fVar2 * fVar2;
    }
    else {
      *(float *)(*(long *)(in_RDI + 0x20) + (long)local_c * 4) =
           fVar1 * (float)*(int *)(in_RDI + 0x18) * fVar2 * fVar2 +
           ((1.0 - fVar1) * (float)*(int *)(in_RDI + 0x18) *
           *(float *)(*(long *)(in_RDI + 0x20) + (long)local_c * 4)) /
           (float)(*(int *)(in_RDI + 0x18) + -1);
    }
  }
  return;
}

Assistant:

void update_eigenvalues()
  {
    for (int i = 1; i <= m; i++)
    {
      float gamma = fmin(learning_rate_cnt / t, 1.f);
      float tmp = data.AZx[i] * data.sketch_cnt;

      if (t == 1)
      {
        ev[i] = gamma * tmp * tmp;
      }
      else
      {
        ev[i] = (1 - gamma) * t * ev[i] / (t - 1) + gamma * t * tmp * tmp;
      }
    }
  }